

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O2

int __thiscall libwebvtt::Parser::Init(Parser *this)

{
  char cVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  string line;
  
  iVar2 = ParseBOM(this);
  if (-1 < iVar2) {
    if (iVar2 == 0) {
      lVar3 = 0;
      while (lVar3 != 6) {
        cVar1 = (&DAT_00131262)[lVar3];
        iVar2 = (**(this->super_LineReader).super_Reader._vptr_Reader)(this,&line);
        if (iVar2 < 0) {
          return iVar2;
        }
        if (iVar2 != 0) {
          return -1;
        }
        lVar3 = lVar3 + 1;
        if ((char)line._M_dataplus._M_p != cVar1) {
          return -1;
        }
      }
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      iVar2 = LineReader::GetLine(&this->super_LineReader,&line);
      if ((-1 < iVar2) && (bVar4 = iVar2 == 0, iVar2 = 0, bVar4)) {
        if ((line._M_string_length == 0) ||
           ((*line._M_dataplus._M_p == ' ' || (*line._M_dataplus._M_p == '\t')))) {
          iVar2 = LineReader::GetLine(&this->super_LineReader,&line);
          bVar4 = iVar2 == 0;
          if ((-1 < iVar2) && (iVar2 = 0, bVar4)) {
            iVar2 = -(uint)(line._M_string_length != 0);
          }
        }
        else {
          iVar2 = -1;
        }
      }
      std::__cxx11::string::~string((string *)&line);
    }
    else {
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int Parser::Init() {
  int e = ParseBOM();

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return -1;

  // Parse "WEBVTT".  We read from the stream one character at-a-time, in
  // order to defend against non-WebVTT streams (e.g. binary files) that don't
  // happen to comprise lines of text demarcated with line terminators.

  const char kId[] = "WEBVTT";

  for (const char* p = kId; *p; ++p) {
    char c;
    e = GetChar(&c);

    if (e < 0)  // error
      return e;

    if (e > 0)  // EOF
      return -1;

    if (c != *p)
      return -1;
  }

  std::string line;

  e = GetLine(&line);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;  // weird but valid

  if (!line.empty()) {
    // Parse optional characters that follow "WEBVTT"

    const char c = line[0];

    if (c != kSPACE && c != kTAB)
      return -1;
  }

  // The WebVTT spec requires that the "WEBVTT" line
  // be followed by an empty line (to separate it from
  // first cue).

  e = GetLine(&line);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;  // weird but we allow it

  if (!line.empty())
    return -1;

  return 0;  // success
}